

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows4_Test::TestBody
          (SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows4_Test *this)

{
  string source;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\n  fn f(): f32\n  {\n    ret 12;\n  }\n  \n  fn main(): f32\n  {\n    let x: function = \\(x: f32): void = { };\n    x = f();\n    ret 0;\n  }\n  "
             ,&local_29);
  throwTest(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAssignmentTypeMismatchThrows4)
{
  std::string source = R"SRC(
  fn f(): f32
  {
    ret 12;
  }
  
  fn main(): f32
  {
    let x: function = \(x: f32): void = { };
    x = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}